

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O3

CESkyCoord * __thiscall
CEPlanet::ObservedCoords
          (CESkyCoord *__return_storage_ptr__,CEPlanet *this,CEDate *date,CEObserver *observer)

{
  CESkyCoord *pCVar1;
  reference pvVar2;
  int i;
  size_type __n;
  CESkyCoordType coordsys;
  double dec;
  double ra;
  vector<double,_std::allocator<double>_> offset;
  vector<double,_std::allocator<double>_> pos_obs;
  CESkyCoord coord;
  CESkyCoordType local_d4;
  double local_d0;
  CEAngle local_c8;
  CESkyCoord *local_b8;
  CEAngle local_b0;
  double local_a0;
  double local_98;
  vector<double,_std::allocator<double>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  CESkyCoord local_60;
  
  local_b8 = __return_storage_ptr__;
  local_60._vptr_CESkyCoord = (_func_int **)CEDate::operator_cast_to_double(date);
  UpdatePosition(this,(double *)&local_60);
  CEObserver::PositionICRS(&local_90,observer,date);
  PositionICRS_Obs(&local_78,this,date);
  __n = 0;
  do {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,__n);
    local_d0 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,__n);
    local_d0 = local_d0 - *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,__n);
    *pvVar2 = local_d0;
    __n = __n + 1;
  } while (__n != 3);
  local_98 = 0.0;
  local_a0 = 0.0;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,0);
  iauC2s(pvVar2,&local_98,&local_a0);
  local_d4 = ICRS;
  if ((this->sofa_planet_id_ == 3.5) && (!NAN(this->sofa_planet_id_))) {
    local_d4 = CIRS;
  }
  CEAngle::CEAngle(&local_c8,&local_98);
  CEAngle::CEAngle(&local_b0,&local_a0);
  CESkyCoord::CESkyCoord(&local_60,&local_c8,&local_b0,&local_d4);
  CEAngle::~CEAngle(&local_b0);
  CEAngle::~CEAngle(&local_c8);
  pCVar1 = local_b8;
  local_c8._vptr_CEAngle._0_4_ = 3;
  CESkyCoord::ConvertTo(local_b8,&local_60,(CESkyCoordType *)&local_c8,date,observer);
  CESkyCoord::~CESkyCoord(&local_60);
  std::vector<double,_std::allocator<double>_>::~vector(&local_78);
  std::vector<double,_std::allocator<double>_>::~vector(&local_90);
  return pCVar1;
}

Assistant:

CESkyCoord CEPlanet::ObservedCoords(const CEDate&     date,
                                    const CEObserver& observer) const
{
    // Update planet position
    UpdatePosition(date);

    // Get the observer ICRS position on a given date and the time-delayed
    // position of the planet on that date
    std::vector<double> offset  = observer.PositionICRS(date);
    std::vector<double> pos_obs = PositionICRS_Obs(date);

    // Compute the difference in coordinates
    for (int i=0; i<3; i++)
        offset[i] = pos_obs[i] - offset[i];

    // Convert the offset into RA,Dec
    double ra(0.0);
    double dec(0.0);
    iauC2s(&offset[0], &ra, &dec);

    // Note that the coordinate system depends on the planet
    CESkyCoordType coordsys = CESkyCoordType::ICRS;
    if (sofa_planet_id_ == 3.5) {
        coordsys = CESkyCoordType::CIRS;
    }
    CESkyCoord coord(ra, dec, coordsys);
    
    return coord.ConvertTo(CESkyCoordType::OBSERVED, date, observer);
}